

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * multiplicative_expression(dmr_C *C,token *token,expression **tree)

{
  uint val;
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  expression *local_48;
  expression **local_40;
  expression *local_38;
  expression *right;
  
  local_48 = (expression *)0x0;
  local_40 = tree;
  ptVar1 = cast_expression(C,token,&local_48);
  peVar4 = local_48;
  if (local_48 == (expression *)0x0) {
    peVar4 = (expression *)0x0;
  }
  else {
    while ((SUB84(ptVar1->pos,0) & 0x3f) == 0x11) {
      local_38 = (expression *)0x0;
      val = (ptVar1->field_2).argnum;
      if ((0x2f < (ulong)val) || ((0x842000000000U >> ((ulong)val & 0x3f) & 1) == 0)) break;
      peVar2 = dmrC_alloc_expression(C,ptVar1->pos,5);
      ptVar1 = cast_expression(C,ptVar1->next,&local_38);
      if (local_38 == (expression *)0x0) {
        pcVar3 = dmrC_show_special(C,val);
        dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
        break;
      }
      peVar2->field_0x1 =
           (byte)((ushort)*(undefined2 *)peVar4 >> 8) & (byte)((ushort)*(undefined2 *)local_38 >> 8)
           & 1;
      peVar2->op = val;
      (peVar2->field_5).field_3.unop = peVar4;
      (peVar2->field_5).field_2.string = (string *)local_38;
      peVar4 = peVar2;
    }
  }
  *local_40 = peVar4;
  return ptVar1;
}

Assistant:

static struct token *multiplicative_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C, 
		token, tree, EXPR_BINOP, cast_expression,
		(op == '*') || (op == '/') || (op == '%')
	);
}